

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.cpp
# Opt level: O0

void ParseStatistics(char *fn,TArray<FStatistics,_FStatistics> *statlist)

{
  FSessionStatistics *this;
  undefined8 this_00;
  bool bVar1;
  uint uVar2;
  TArray<FLevelStatistics,_FLevelStatistics> *this_01;
  CRecoverableError *anon_var_0;
  int local_158;
  int s_1;
  int m_1;
  int h_1;
  FLevelStatistics *lstats;
  int local_140;
  int s;
  int m;
  int h;
  FSessionStatistics *session;
  FStatistics *ep_entry;
  undefined1 local_118 [8];
  FScanner sc;
  TArray<FStatistics,_FStatistics> *statlist_local;
  char *fn_local;
  
  sc._248_8_ = statlist;
  TArray<FStatistics,_FStatistics>::Clear(statlist);
  FScanner::FScanner((FScanner *)local_118);
  FScanner::OpenFile((FScanner *)local_118,fn);
  while (bVar1 = FScanner::GetString((FScanner *)local_118), this_00 = sc._248_8_, bVar1) {
    uVar2 = TArray<FStatistics,_FStatistics>::Reserve
                      ((TArray<FStatistics,_FStatistics> *)sc._248_8_,1);
    session = (FSessionStatistics *)
              TArray<FStatistics,_FStatistics>::operator[]
                        ((TArray<FStatistics,_FStatistics> *)this_00,(ulong)uVar2);
    FString::operator=((FString *)((long)(session->super_FLevelStatistics).info + 0x18),
                       (char *)local_118);
    FScanner::MustGetString((FScanner *)local_118);
    FString::operator=((FString *)((session->super_FLevelStatistics).info + 0x10),(char *)local_118)
    ;
    FScanner::MustGetStringName((FScanner *)local_118,"{");
    while (bVar1 = FScanner::CheckString((FScanner *)local_118,"}"), this = session,
          ((bVar1 ^ 0xffU) & 1) != 0) {
      uVar2 = TArray<FSessionStatistics,_FSessionStatistics>::Reserve
                        ((TArray<FSessionStatistics,_FSessionStatistics> *)session,1);
      _m = TArray<FSessionStatistics,_FSessionStatistics>::operator[]
                     ((TArray<FSessionStatistics,_FSessionStatistics> *)this,(ulong)uVar2);
      FScanner::MustGetString((FScanner *)local_118);
      FScanner::MustGetString((FScanner *)local_118);
      strncpy((_m->super_FLevelStatistics).name,(char *)local_118,0xc);
      FScanner::MustGetString((FScanner *)local_118);
      strncpy((char *)_m,(char *)local_118,0x1e);
      FScanner::MustGetString((FScanner *)local_118);
      __isoc99_sscanf(local_118,"%d:%d:%d",&s,&local_140,(long)&lstats + 4);
      (_m->super_FLevelStatistics).timeneeded =
           ((s * 0x3c + local_140) * 0x3c + lstats._4_4_) * 0x23;
      FScanner::MustGetNumber((FScanner *)local_118);
      (_m->super_FLevelStatistics).skill = (short)sc.StringLen;
      bVar1 = FScanner::CheckString((FScanner *)local_118,"{");
      if (bVar1) {
        while (bVar1 = FScanner::CheckString((FScanner *)local_118,"}"), ((bVar1 ^ 0xffU) & 1) != 0)
        {
          this_01 = &_m->levelstats;
          uVar2 = TArray<FLevelStatistics,_FLevelStatistics>::Reserve(this_01,1);
          _m_1 = TArray<FLevelStatistics,_FLevelStatistics>::operator[](this_01,(ulong)uVar2);
          FScanner::MustGetString((FScanner *)local_118);
          strncpy(_m_1->name,(char *)local_118,0xc);
          FScanner::MustGetString((FScanner *)local_118);
          strncpy(_m_1->info,(char *)local_118,0x1e);
          FScanner::MustGetString((FScanner *)local_118);
          __isoc99_sscanf(local_118,"%d:%d:%d",&s_1,&local_158,(long)&anon_var_0 + 4);
          _m_1->timeneeded = ((s_1 * 0x3c + local_158) * 0x3c + anon_var_0._4_4_) * 0x23;
          _m_1->skill = 0;
        }
      }
    }
  }
  FScanner::~FScanner((FScanner *)local_118);
  return;
}

Assistant:

static void ParseStatistics(const char *fn, TArray<FStatistics> &statlist)
{
	statlist.Clear();
	try
	{
		FScanner sc;
		sc.OpenFile(fn);

		while (sc.GetString())
		{
			FStatistics &ep_entry = statlist[statlist.Reserve(1)];

			ep_entry.epi_header = sc.String;
			sc.MustGetString();
			ep_entry.epi_name = sc.String;

			sc.MustGetStringName("{");
			while (!sc.CheckString("}"))
			{
				FSessionStatistics &session = ep_entry.stats[ep_entry.stats.Reserve(1)];

				sc.MustGetString();
				sc.MustGetString();
				strncpy(session.name, sc.String, 12);
				sc.MustGetString();
				strncpy(session.info, sc.String, 30);

				int h,m,s;
				sc.MustGetString();
				sscanf(sc.String, "%d:%d:%d", &h, &m, &s);
				session.timeneeded= ((((h*60)+m)*60)+s)*TICRATE;

				sc.MustGetNumber();
				session.skill=sc.Number;
				if (sc.CheckString("{"))
				{
					while (!sc.CheckString("}"))
					{
						FLevelStatistics &lstats = session.levelstats[session.levelstats.Reserve(1)];

						sc.MustGetString();
						strncpy(lstats.name, sc.String, 12);
						sc.MustGetString();
						strncpy(lstats.info, sc.String, 30);

						int h,m,s;
						sc.MustGetString();
						sscanf(sc.String, "%d:%d:%d", &h, &m, &s);
						lstats.timeneeded= ((((h*60)+m)*60)+s)*TICRATE;

						lstats.skill = 0;
					}
				}
			}
		}
	}
	catch(CRecoverableError &)
	{
	}
}